

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O2

void init_functions(void)

{
  DFsScript *this;
  int iVar1;
  PClassActor *pPVar2;
  DFsVariable *pDVar3;
  FLineSpecial *pFVar4;
  PClassActor **ppPVar5;
  int i;
  int special;
  long lVar6;
  
  ppPVar5 = ActorTypes;
  for (lVar6 = 0; this = global_script, lVar6 != 0x22c; lVar6 = lVar6 + 4) {
    pPVar2 = PClass::FindActor((char *)((long)&_ZL15ActorNames_init_rel +
                                       (long)*(int *)((long)&_ZL15ActorNames_init_rel + lVar6)));
    *ppPVar5 = pPVar2;
    ppPVar5 = ppPVar5 + 1;
  }
  pDVar3 = DFsScript::NewVariable(global_script,"consoleplayer",7);
  (pDVar3->value).pI = &consoleplayer;
  pDVar3 = DFsScript::NewVariable(this,"displayplayer",7);
  (pDVar3->value).pI = &consoleplayer;
  pDVar3 = DFsScript::NewVariable(this,"zoom",7);
  (pDVar3->value).pI = &zoom;
  pDVar3 = DFsScript::NewVariable(this,"fov",7);
  (pDVar3->value).pI = &zoom;
  pDVar3 = DFsScript::NewVariable(this,"trigger",8);
  (pDVar3->value).pI = (int *)&trigger_obj;
  iVar1 = P_GetMaxLineSpecial();
  for (special = 0; special <= iVar1; special = special + 1) {
    pFVar4 = P_GetLineSpecialInfo(special);
    if ((pFVar4 != (FLineSpecial *)0x0) && (-1 < pFVar4->max_args)) {
      pDVar3 = DFsScript::NewVariable(this,pFVar4->name,9);
      (pDVar3->value).ls = pFVar4;
    }
  }
  DFsScript::NewFunction(this,"break",0x5e4c94);
  DFsScript::NewFunction(this,"continue",0x5e4c62);
  DFsScript::NewFunction(this,"return",0x5e4d08);
  DFsScript::NewFunction(this,"goto",0x5e4cca);
  DFsScript::NewFunction(this,"include",0x5e4d26);
  DFsScript::NewFunction(this,"print",0x5e4b78);
  DFsScript::NewFunction(this,"rnd",0x5e4bc8);
  DFsScript::NewFunction(this,"prnd",0x5e4bc8);
  DFsScript::NewFunction(this,"input",0x5e4d96);
  DFsScript::NewFunction(this,"beep",0x5e4daa);
  DFsScript::NewFunction(this,"clock",0x5e4dd8);
  DFsScript::NewFunction(this,"wait",0x5e9ce8);
  DFsScript::NewFunction(this,"tagwait",0x5e9d4a);
  DFsScript::NewFunction(this,"scriptwait",0x5e9da4);
  DFsScript::NewFunction(this,"startscript",0x5e9e58);
  DFsScript::NewFunction(this,"scriptrunning",0x5e9f54);
  DFsScript::NewFunction(this,"startskill",0x5e6f8c);
  DFsScript::NewFunction(this,"exitlevel",0x5e4dfa);
  DFsScript::NewFunction(this,"tip",0x5e4e04);
  DFsScript::NewFunction(this,"timedtip",0x5e4ea8);
  DFsScript::NewFunction(this,"message",0x5e5060);
  DFsScript::NewFunction(this,"gameskill",0x5e76e0);
  DFsScript::NewFunction(this,"gamemode",0x5e7700);
  DFsScript::NewFunction(this,"playermsg",0x5e50f6);
  DFsScript::NewFunction(this,"playertip",0x5e4f56);
  DFsScript::NewFunction(this,"playeringame",0x5e5188);
  DFsScript::NewFunction(this,"playername",0x5e51c8);
  DFsScript::NewFunction(this,"playeraddfrag",0x5e8cce);
  DFsScript::NewFunction(this,"playerobj",0x5e528a);
  DFsScript::NewFunction(this,"isplayerobj",0x5e7742);
  DFsScript::NewFunction(this,"isobjplayer",0x5e7742);
  DFsScript::NewFunction(this,"skincolor",0x5e8d74);
  DFsScript::NewFunction(this,"playerkeys",0x5e7792);
  DFsScript::NewFunction(this,"playerammo",0x5e7a0a);
  DFsScript::NewFunction(this,"maxplayerammo",0x5e7b84);
  DFsScript::NewFunction(this,"playerweapon",0x5e7cfa);
  DFsScript::NewFunction(this,"playerselwep",0x5e7e76);
  DFsScript::NewFunction(this,"spawn",0x5e53a0);
  DFsScript::NewFunction(this,"spawnexplosion",0x5e8566);
  DFsScript::NewFunction(this,"radiusattack",0x5e86e6);
  DFsScript::NewFunction(this,"kill",0x5e55e0);
  DFsScript::NewFunction(this,"removeobj",0x5e55a8);
  DFsScript::NewFunction(this,"objx",0x5e5656);
  DFsScript::NewFunction(this,"objy",0x5e56ae);
  DFsScript::NewFunction(this,"objz",0x5e5706);
  DFsScript::NewFunction(this,"testlocation",0x5e882a);
  DFsScript::NewFunction(this,"teleport",0x5e57ba);
  DFsScript::NewFunction(this,"silentteleport",0x5e583a);
  DFsScript::NewFunction(this,"damageobj",0x5e58ba);
  DFsScript::NewFunction(this,"healobj",0x5e8878);
  DFsScript::NewFunction(this,"player",0x5e5336);
  DFsScript::NewFunction(this,"objsector",0x5e5964);
  DFsScript::NewFunction(this,"objflag",0x5e5a0c);
  DFsScript::NewFunction(this,"pushobj",0x5e5b0c);
  DFsScript::NewFunction(this,"pushthing",0x5e5b0c);
  DFsScript::NewFunction(this,"objangle",0x5e575e);
  DFsScript::NewFunction(this,"objhealth",0x5e59be);
  DFsScript::NewFunction(this,"objdead",0x5e8916);
  DFsScript::NewFunction(this,"reactiontime",0x5e5b7c);
  DFsScript::NewFunction(this,"objreactiontime",0x5e5b7c);
  DFsScript::NewFunction(this,"objtarget",0x5e5c00);
  DFsScript::NewFunction(this,"objmomx",0x5e5cb8);
  DFsScript::NewFunction(this,"objmomy",0x5e5d40);
  DFsScript::NewFunction(this,"objmomz",0x5e5dc8);
  DFsScript::NewFunction(this,"spawnmissile",0x5e8970);
  DFsScript::NewFunction(this,"mapthings",0x5e8b0e);
  DFsScript::NewFunction(this,"objtype",0x5e8ee2);
  DFsScript::NewFunction(this,"mapthingnumexist",0x5e8a18);
  DFsScript::NewFunction(this,"objstate",0x5e8b34);
  DFsScript::NewFunction(this,"resurrect",0x5e8d7a);
  DFsScript::NewFunction(this,"lineattack",0x5e8e08);
  DFsScript::NewFunction(this,"setobjposition",0x5e876a);
  DFsScript::NewFunction(this,"floorheight",0x5e63d4);
  DFsScript::NewFunction(this,"floortext",0x5e6cb4);
  DFsScript::NewFunction(this,"floortexture",0x5e6cb4);
  DFsScript::NewFunction(this,"movefloor",0x5e65be);
  DFsScript::NewFunction(this,"ceilheight",0x5e66b6);
  DFsScript::NewFunction(this,"ceilingheight",0x5e66b6);
  DFsScript::NewFunction(this,"moveceil",0x5e68a0);
  DFsScript::NewFunction(this,"moveceiling",0x5e68a0);
  DFsScript::NewFunction(this,"ceilingtexture",0x5e6e1e);
  DFsScript::NewFunction(this,"ceiltext",0x5e6e1e);
  DFsScript::NewFunction(this,"lightlevel",0x5e69d2);
  DFsScript::NewFunction(this,"fadelight",0x5e6bbc);
  DFsScript::NewFunction(this,"colormap",0x5e6e1c);
  DFsScript::NewFunction(this,"setcamera",0x5e5fe8);
  DFsScript::NewFunction(this,"clearcamera",0x5e619a);
  DFsScript::NewFunction(this,"movecamera",0x5e8216);
  DFsScript::NewFunction(this,"pointtoangle",0x5e5e50);
  DFsScript::NewFunction(this,"pointtodist",0x5e5f34);
  DFsScript::NewFunction(this,"startsound",0x5e61fc);
  DFsScript::NewFunction(this,"startsectorsound",0x5e6330);
  DFsScript::NewFunction(this,"ambientsound",0x5e8438);
  DFsScript::NewFunction(this,"startambiantsound",0x5e8438);
  DFsScript::NewFunction(this,"changemusic",0x5e72f8);
  DFsScript::NewFunction(this,"changehublevel",0x5e6f7e);
  DFsScript::NewFunction(this,"opendoor",0x5e6f9a);
  DFsScript::NewFunction(this,"closedoor",0x5e7088);
  DFsScript::NewFunction(this,"newhupic",0x5e9240);
  DFsScript::NewFunction(this,"createpic",0x5e9240);
  DFsScript::NewFunction(this,"deletehupic",0x5e92ba);
  DFsScript::NewFunction(this,"modifyhupic",0x5e9302);
  DFsScript::NewFunction(this,"modifypic",0x5e9302);
  DFsScript::NewFunction(this,"sethupicdisplay",0x5e93c8);
  DFsScript::NewFunction(this,"setpicvisible",0x5e93c8);
  DFsScript::NewFunction(this,"playdemo",0x5e8d76);
  DFsScript::NewFunction(this,"runcommand",0x5e7116);
  DFsScript::NewFunction(this,"checkcvar",0x5e8d78);
  DFsScript::NewFunction(this,"setlinetexture",0x5e744c);
  DFsScript::NewFunction(this,"linetrigger",0x5e7162);
  DFsScript::NewFunction(this,"lineflag",0x5e8c00);
  DFsScript::NewFunction(this,"max",0x5e7612);
  DFsScript::NewFunction(this,"min",0x5e765e);
  DFsScript::NewFunction(this,"abs",0x5e76aa);
  DFsScript::NewFunction(this,"sin",0x5e8f66);
  DFsScript::NewFunction(this,"asin",0x5e8fa6);
  DFsScript::NewFunction(this,"cos",0x5e8fe6);
  DFsScript::NewFunction(this,"acos",0x5e9026);
  DFsScript::NewFunction(this,"tan",0x5e9066);
  DFsScript::NewFunction(this,"atan",0x5e90a6);
  DFsScript::NewFunction(this,"exp",0x5e90e6);
  DFsScript::NewFunction(this,"log",0x5e9126);
  DFsScript::NewFunction(this,"sqrt",0x5e9166);
  DFsScript::NewFunction(this,"floor",0x5e91a6);
  DFsScript::NewFunction(this,"pow",0x5e91da);
  DFsScript::NewFunction(this,"setlineblocking",0x5e7320);
  DFsScript::NewFunction(this,"setlinetrigger",0x5e9aba);
  DFsScript::NewFunction(this,"setlinemnblock",0x5e73bc);
  DFsScript::NewFunction(this,"scriptwaitpre",0x5e9dfe);
  DFsScript::NewFunction(this,"exitsecret",0x5e8484);
  DFsScript::NewFunction(this,"objawaken",0x5e83d2);
  DFsScript::NewFunction(this,"mobjvalue",0x5e848c);
  DFsScript::NewFunction(this,"stringvalue",0x5e84bc);
  DFsScript::NewFunction(this,"intvalue",0x5e850a);
  DFsScript::NewFunction(this,"fixedvalue",0x5e8538);
  DFsScript::NewFunction(this,"spawnshot2",0x5e9888);
  DFsScript::NewFunction(this,"setcolor",0x5e9752);
  DFsScript::NewFunction(this,"objradius",0x5e94bc);
  DFsScript::NewFunction(this,"objheight",0x5e9544);
  DFsScript::NewFunction(this,"thingcount",0x5e95cc);
  DFsScript::NewFunction(this,"killinsector",0x5e99fe);
  DFsScript::NewFunction(this,"levelnum",0x5e94a0);
  DFsScript::NewFunction(this,"giveinventory",0x5e7fb2);
  DFsScript::NewFunction(this,"takeinventory",0x5e804c);
  DFsScript::NewFunction(this,"checkinventory",0x5e80dc);
  DFsScript::NewFunction(this,"setweapon",0x5e814c);
  DFsScript::NewFunction(this,"setcorona",0x5e9446);
  return;
}

Assistant:

void init_functions(void)
{
	for(unsigned i=0;i<countof(ActorNames_init);i++)
	{
		ActorTypes[i]=PClass::FindActor(ActorNames_init[i]);
	}

	DFsScript * gscr = global_script;

	// add all the functions
	gscr->NewVariable("consoleplayer", svt_pInt)->value.pI = &consoleplayer;
	gscr->NewVariable("displayplayer", svt_pInt)->value.pI = &consoleplayer;
	gscr->NewVariable("zoom", svt_pInt)->value.pI = &zoom;
	gscr->NewVariable("fov", svt_pInt)->value.pI = &zoom;
	gscr->NewVariable("trigger", svt_pMobj)->value.pMobj = &trigger_obj;

	// Create constants for all existing line specials
	int max = P_GetMaxLineSpecial();
	for(int i=0; i<=max; i++)
	{
		const FLineSpecial *ls = P_GetLineSpecialInfo(i);

		if (ls != NULL && ls->max_args >= 0)	// specials with max args set to -1 can only be used in a map and are of no use hee.
		{
			gscr->NewVariable(ls->name, svt_linespec)->value.ls = ls;
		}
	}
	
	// important C-emulating stuff
	gscr->NewFunction("break", &FParser::SF_Break);
	gscr->NewFunction("continue", &FParser::SF_Continue);
	gscr->NewFunction("return", &FParser::SF_Return);
	gscr->NewFunction("goto", &FParser::SF_Goto);
	gscr->NewFunction("include", &FParser::SF_Include);
	
	// standard FraggleScript functions
	gscr->NewFunction("print", &FParser::SF_Print);
	gscr->NewFunction("rnd", &FParser::SF_Rnd);	// Legacy uses a normal rand() call for this which is extremely dangerous.
	gscr->NewFunction("prnd", &FParser::SF_Rnd);	// I am mapping rnd and prnd to the same named RNG which should eliminate any problem
	gscr->NewFunction("input", &FParser::SF_Input);
	gscr->NewFunction("beep", &FParser::SF_Beep);
	gscr->NewFunction("clock", &FParser::SF_Clock);
	gscr->NewFunction("wait", &FParser::SF_Wait);
	gscr->NewFunction("tagwait", &FParser::SF_TagWait);
	gscr->NewFunction("scriptwait", &FParser::SF_ScriptWait);
	gscr->NewFunction("startscript", &FParser::SF_StartScript);
	gscr->NewFunction("scriptrunning", &FParser::SF_ScriptRunning);
	
	// doom stuff
	gscr->NewFunction("startskill", &FParser::SF_StartSkill);
	gscr->NewFunction("exitlevel", &FParser::SF_ExitLevel);
	gscr->NewFunction("tip", &FParser::SF_Tip);
	gscr->NewFunction("timedtip", &FParser::SF_TimedTip);
	gscr->NewFunction("message", &FParser::SF_Message);
	gscr->NewFunction("gameskill", &FParser::SF_Gameskill);
	gscr->NewFunction("gamemode", &FParser::SF_Gamemode);
	
	// player stuff
	gscr->NewFunction("playermsg", &FParser::SF_PlayerMsg);
	gscr->NewFunction("playertip", &FParser::SF_PlayerTip);
	gscr->NewFunction("playeringame", &FParser::SF_PlayerInGame);
	gscr->NewFunction("playername", &FParser::SF_PlayerName);
	gscr->NewFunction("playeraddfrag", &FParser::SF_PlayerAddFrag);
	gscr->NewFunction("playerobj", &FParser::SF_PlayerObj);
	gscr->NewFunction("isplayerobj", &FParser::SF_IsPlayerObj);
	gscr->NewFunction("isobjplayer", &FParser::SF_IsPlayerObj);
	gscr->NewFunction("skincolor", &FParser::SF_SkinColor);
	gscr->NewFunction("playerkeys", &FParser::SF_PlayerKeys);
	gscr->NewFunction("playerammo", &FParser::SF_PlayerAmmo);
	gscr->NewFunction("maxplayerammo", &FParser::SF_MaxPlayerAmmo); 
	gscr->NewFunction("playerweapon", &FParser::SF_PlayerWeapon);
	gscr->NewFunction("playerselwep", &FParser::SF_PlayerSelectedWeapon);
	
	// mobj stuff
	gscr->NewFunction("spawn", &FParser::SF_Spawn);
	gscr->NewFunction("spawnexplosion", &FParser::SF_SpawnExplosion);
	gscr->NewFunction("radiusattack", &FParser::SF_RadiusAttack);
	gscr->NewFunction("kill", &FParser::SF_KillObj);
	gscr->NewFunction("removeobj", &FParser::SF_RemoveObj);
	gscr->NewFunction("objx", &FParser::SF_ObjX);
	gscr->NewFunction("objy", &FParser::SF_ObjY);
	gscr->NewFunction("objz", &FParser::SF_ObjZ);
	gscr->NewFunction("testlocation", &FParser::SF_TestLocation);
	gscr->NewFunction("teleport", &FParser::SF_Teleport);
	gscr->NewFunction("silentteleport", &FParser::SF_SilentTeleport);
	gscr->NewFunction("damageobj", &FParser::SF_DamageObj);
	gscr->NewFunction("healobj", &FParser::SF_HealObj);
	gscr->NewFunction("player", &FParser::SF_Player);
	gscr->NewFunction("objsector", &FParser::SF_ObjSector);
	gscr->NewFunction("objflag", &FParser::SF_ObjFlag);
	gscr->NewFunction("pushobj", &FParser::SF_PushThing);
	gscr->NewFunction("pushthing", &FParser::SF_PushThing);
	gscr->NewFunction("objangle", &FParser::SF_ObjAngle);
	gscr->NewFunction("objhealth", &FParser::SF_ObjHealth);
	gscr->NewFunction("objdead", &FParser::SF_ObjDead);
	gscr->NewFunction("reactiontime", &FParser::SF_ReactionTime);
	gscr->NewFunction("objreactiontime", &FParser::SF_ReactionTime);
	gscr->NewFunction("objtarget", &FParser::SF_MobjTarget);
	gscr->NewFunction("objmomx", &FParser::SF_MobjMomx);
	gscr->NewFunction("objmomy", &FParser::SF_MobjMomy);
	gscr->NewFunction("objmomz", &FParser::SF_MobjMomz);

	gscr->NewFunction("spawnmissile", &FParser::SF_SpawnMissile);
	gscr->NewFunction("mapthings", &FParser::SF_MapThings);
	gscr->NewFunction("objtype", &FParser::SF_ObjType);
	gscr->NewFunction("mapthingnumexist", &FParser::SF_MapThingNumExist);
	gscr->NewFunction("objstate", &FParser::SF_ObjState);
	gscr->NewFunction("resurrect", &FParser::SF_Resurrect);
	gscr->NewFunction("lineattack", &FParser::SF_LineAttack);
	gscr->NewFunction("setobjposition", &FParser::SF_SetObjPosition);

	// sector stuff
	gscr->NewFunction("floorheight", &FParser::SF_FloorHeight);
	gscr->NewFunction("floortext", &FParser::SF_FloorTexture);
	gscr->NewFunction("floortexture", &FParser::SF_FloorTexture);   // haleyjd: alias
	gscr->NewFunction("movefloor", &FParser::SF_MoveFloor);
	gscr->NewFunction("ceilheight", &FParser::SF_CeilingHeight);
	gscr->NewFunction("ceilingheight", &FParser::SF_CeilingHeight); // haleyjd: alias
	gscr->NewFunction("moveceil", &FParser::SF_MoveCeiling);
	gscr->NewFunction("moveceiling", &FParser::SF_MoveCeiling);     // haleyjd: aliases
	gscr->NewFunction("ceilingtexture", &FParser::SF_CeilingTexture);
	gscr->NewFunction("ceiltext", &FParser::SF_CeilingTexture);  // haleyjd: wrong
	gscr->NewFunction("lightlevel", &FParser::SF_LightLevel);    // handler - was
	gscr->NewFunction("fadelight", &FParser::SF_FadeLight);      // &FParser::SF_FloorTexture!
	gscr->NewFunction("colormap", &FParser::SF_SectorColormap);
	
	// cameras!
	gscr->NewFunction("setcamera", &FParser::SF_SetCamera);
	gscr->NewFunction("clearcamera", &FParser::SF_ClearCamera);
	gscr->NewFunction("movecamera", &FParser::SF_MoveCamera);
	
	// trig functions
	gscr->NewFunction("pointtoangle", &FParser::SF_PointToAngle);
	gscr->NewFunction("pointtodist", &FParser::SF_PointToDist);
	
	// sound functions
	gscr->NewFunction("startsound", &FParser::SF_StartSound);
	gscr->NewFunction("startsectorsound", &FParser::SF_StartSectorSound);
	gscr->NewFunction("ambientsound", &FParser::SF_AmbientSound);
	gscr->NewFunction("startambiantsound", &FParser::SF_AmbientSound);	// Legacy's incorrectly spelled name!
	gscr->NewFunction("changemusic", &FParser::SF_ChangeMusic);
	
	// hubs!
	gscr->NewFunction("changehublevel", &FParser::SF_ChangeHubLevel);
	
	// doors
	gscr->NewFunction("opendoor", &FParser::SF_OpenDoor);
	gscr->NewFunction("closedoor", &FParser::SF_CloseDoor);

	// HU Graphics
	gscr->NewFunction("newhupic", &FParser::SF_NewHUPic);
	gscr->NewFunction("createpic", &FParser::SF_NewHUPic);
	gscr->NewFunction("deletehupic", &FParser::SF_DeleteHUPic);
	gscr->NewFunction("modifyhupic", &FParser::SF_ModifyHUPic);
	gscr->NewFunction("modifypic", &FParser::SF_ModifyHUPic);
	gscr->NewFunction("sethupicdisplay", &FParser::SF_SetHUPicDisplay);
	gscr->NewFunction("setpicvisible", &FParser::SF_SetHUPicDisplay);

	//
	gscr->NewFunction("playdemo", &FParser::SF_PlayDemo);
	gscr->NewFunction("runcommand", &FParser::SF_RunCommand);
	gscr->NewFunction("checkcvar", &FParser::SF_CheckCVar);
	gscr->NewFunction("setlinetexture", &FParser::SF_SetLineTexture);
	gscr->NewFunction("linetrigger", &FParser::SF_LineTrigger);
	gscr->NewFunction("lineflag", &FParser::SF_LineFlag);

	//Hurdler: new math functions
	gscr->NewFunction("max", &FParser::SF_Max);
	gscr->NewFunction("min", &FParser::SF_Min);
	gscr->NewFunction("abs", &FParser::SF_Abs);

	gscr->NewFunction("sin", &FParser::SF_Sin);
	gscr->NewFunction("asin", &FParser::SF_ASin);
	gscr->NewFunction("cos", &FParser::SF_Cos);
	gscr->NewFunction("acos", &FParser::SF_ACos);
	gscr->NewFunction("tan", &FParser::SF_Tan);
	gscr->NewFunction("atan", &FParser::SF_ATan);
	gscr->NewFunction("exp", &FParser::SF_Exp);
	gscr->NewFunction("log", &FParser::SF_Log);
	gscr->NewFunction("sqrt", &FParser::SF_Sqrt);
	gscr->NewFunction("floor", &FParser::SF_Floor);
	gscr->NewFunction("pow", &FParser::SF_Pow);
	
	// Eternity extensions
	gscr->NewFunction("setlineblocking", &FParser::SF_SetLineBlocking);
	gscr->NewFunction("setlinetrigger", &FParser::SF_SetLineTrigger);
	gscr->NewFunction("setlinemnblock", &FParser::SF_SetLineMonsterBlocking);
	gscr->NewFunction("scriptwaitpre", &FParser::SF_ScriptWaitPre);
	gscr->NewFunction("exitsecret", &FParser::SF_ExitSecret);
	gscr->NewFunction("objawaken", &FParser::SF_ObjAwaken);
	
	// forced coercion functions
	gscr->NewFunction("mobjvalue", &FParser::SF_MobjValue);
	gscr->NewFunction("stringvalue", &FParser::SF_StringValue);
	gscr->NewFunction("intvalue", &FParser::SF_IntValue);
	gscr->NewFunction("fixedvalue", &FParser::SF_FixedValue);

	// new for GZDoom
	gscr->NewFunction("spawnshot2", &FParser::SF_SpawnShot2);
	gscr->NewFunction("setcolor", &FParser::SF_SetColor);
	gscr->NewFunction("objradius", &FParser::SF_MobjRadius);
	gscr->NewFunction("objheight", &FParser::SF_MobjHeight);
	gscr->NewFunction("thingcount", &FParser::SF_ThingCount);
	gscr->NewFunction("killinsector", &FParser::SF_KillInSector);
	gscr->NewFunction("levelnum", &FParser::SF_LevelNum);

	// new inventory
	gscr->NewFunction("giveinventory", &FParser::SF_GiveInventory);
	gscr->NewFunction("takeinventory", &FParser::SF_TakeInventory);
	gscr->NewFunction("checkinventory", &FParser::SF_CheckInventory);
	gscr->NewFunction("setweapon", &FParser::SF_SetWeapon);

	// Dummies - shut up warnings
	gscr->NewFunction("setcorona", &FParser::SF_SetCorona);
}